

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::UpdateRotation(ChElementBeamTaperedTimoshenko *this)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
  PVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChVector<double> v;
  ChMatrix33<double> Aabs;
  ChVector<double> myele_wB;
  ChVector<double> myele_wA;
  ChVector<double> myele_w;
  ChMatrix33<double> A0;
  ChQuaternion<double> local_158;
  undefined1 local_138 [16];
  double local_128;
  ChMatrix33<double> local_118;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  ChVector<double> local_90;
  Matrix<double,_3,_3,_1,_3,_3> local_78;
  
  ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)&local_78,&this->q_element_ref_rot);
  if (this->disable_corotate == true) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
              (&local_118.super_Matrix<double,_3,_3,_1,_3,_3>,&local_78);
    dVar5 = (this->q_element_ref_rot).m_data[1];
    dVar6 = (this->q_element_ref_rot).m_data[2];
    dVar7 = (this->q_element_ref_rot).m_data[3];
    (this->q_element_abs_rot).m_data[0] = (this->q_element_ref_rot).m_data[0];
    (this->q_element_abs_rot).m_data[1] = dVar5;
    (this->q_element_abs_rot).m_data[2] = dVar6;
    (this->q_element_abs_rot).m_data[3] = dVar7;
  }
  else {
    psVar1 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_138 = vsubpd_avx(*(undefined1 (*) [16])((long)&peVar3->super_ChNodeFEAbase + 0x20),
                           *(undefined1 (*) [16])((long)&peVar2->super_ChNodeFEAbase + 0x20));
    local_128 = *(double *)&peVar3->field_0x30 - *(double *)&peVar2->field_0x30;
    PVar4 = (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
             )vmovhpd_avx(ZEXT816(0),0x3ff0000000000000);
    local_158.m_data[2] = 0.0;
    local_158.m_data._0_16_ = PVar4;
    ChQuaternion<double>::RotateBack(&this->q_refrotA,(ChVector<double> *)&local_158);
    ChQuaternion<double>::Rotate
              ((ChQuaternion<double> *)&peVar2->field_0x38,(ChVector<double> *)&local_118);
    peVar2 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_158.m_data[2] = 0.0;
    local_158.m_data._0_16_ = PVar4;
    ChQuaternion<double>::RotateBack(&this->q_refrotB,(ChVector<double> *)&local_158);
    ChQuaternion<double>::Rotate
              ((ChQuaternion<double> *)&peVar2->field_0x38,(ChVector<double> *)&local_118);
    local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_a8 + local_c8;
    local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         dStack_a0 + dStack_c0;
    local_118.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_98 + local_b8;
    ChVector<double>::GetNormalized(&local_90,(ChVector<double> *)&local_118);
    ChMatrix33<double>::Set_A_Xdir(&local_118,(ChVector<double> *)local_138,&local_90);
    ChMatrix33<double>::Get_A_quaternion(&local_158,&local_118);
    ChQuaternion<double>::operator=(&this->q_element_abs_rot,&local_158);
  }
  local_158.m_data[1] = (double)&local_118;
  local_158.m_data[0] = (double)&local_78;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
              *)&local_158);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::UpdateRotation() {
    ChMatrix33<> A0(this->q_element_ref_rot);

    ChMatrix33<> Aabs;
    if (this->disable_corotate) {
        Aabs = A0;
        q_element_abs_rot = q_element_ref_rot;
    } else {
        ChVector<> mXele_w = nodes[1]->Frame().GetPos() - nodes[0]->Frame().GetPos();
        // propose Y_w as absolute dir of the Y axis of A node, removing the effect of Aref-to-A rotation if any:
        //    Y_w = [R Aref->w ]*[R Aref->A ]'*{0,1,0}
        ChVector<> myele_wA = nodes[0]->Frame().GetRot().Rotate(q_refrotA.RotateBack(ChVector<>(0, 1, 0)));
        // propose Y_w as absolute dir of the Y axis of B node, removing the effect of Bref-to-B rotation if any:
        //    Y_w = [R Bref->w ]*[R Bref->B ]'*{0,1,0}
        ChVector<> myele_wB = nodes[1]->Frame().GetRot().Rotate(q_refrotB.RotateBack(ChVector<>(0, 1, 0)));
        // Average the two Y directions to have midpoint torsion (ex -30?torsion A and +30?torsion B= 0?
        ChVector<> myele_w = (myele_wA + myele_wB).GetNormalized();
        Aabs.Set_A_Xdir(mXele_w, myele_w);
        q_element_abs_rot = Aabs.Get_A_quaternion();
    }

    this->A = A0.transpose() * Aabs;
}